

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

void replace_default_logger_example(void)

{
  logger *plVar1;
  shared_ptr<spdlog::logger> new_logger;
  shared_ptr<spdlog::logger> old_logger;
  bool local_149;
  shared_ptr<spdlog::logger> local_148;
  shared_ptr<spdlog::logger> local_138;
  element_type *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  element_type *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  _Any_data local_108;
  code *local_f8;
  undefined8 uStack_f0;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  _Any_data local_c8;
  code *local_b8;
  undefined8 uStack_b0;
  _Any_data local_a8;
  code *local_98;
  undefined8 uStack_90;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  spdlog::default_logger();
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"new_default_logger","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"logs/new-default-log.txt","")
  ;
  local_98 = (code *)0x0;
  uStack_90 = 0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_b8 = (code *)0x0;
  uStack_b0 = 0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_d8 = (code *)0x0;
  uStack_d0 = 0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_f8 = (code *)0x0;
  uStack_f0 = 0;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_149 = true;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_80,local_80 + local_78);
  spdlog::synchronous_factory::
  create<spdlog::sinks::basic_file_sink<std::mutex>,std::__cxx11::string_const&,bool&,spdlog::file_event_handlers_const&>
            ((synchronous_factory *)&local_128,&local_40,&local_60,&local_149,
             (file_event_handlers *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  local_138.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_128;
  local_138.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_120;
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_120->_M_use_count = local_120->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_120->_M_use_count = local_120->_M_use_count + 1;
    }
  }
  spdlog::set_default_logger(&local_138);
  if (local_138.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  spdlog::set_level(info);
  plVar1 = spdlog::default_logger_raw();
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f8 = (code *)0x0;
  spdlog::logger::log(plVar1,0.0);
  spdlog::set_level(trace);
  plVar1 = spdlog::default_logger_raw();
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f8 = (code *)0x0;
  spdlog::logger::log(plVar1,0.0);
  local_148.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_118;
  local_148.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_110;
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_110->_M_use_count = local_110->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_110->_M_use_count = local_110->_M_use_count + 1;
    }
  }
  spdlog::set_default_logger(&local_148);
  if (local_148.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
  }
  if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
  }
  return;
}

Assistant:

void replace_default_logger_example() {
    // store the old logger so we don't break other examples.
    auto old_logger = spdlog::default_logger();

    auto new_logger =
        spdlog::basic_logger_mt("new_default_logger", "logs/new-default-log.txt", true);
    spdlog::set_default_logger(new_logger);
    spdlog::set_level(spdlog::level::info);
    spdlog::debug("This message should not be displayed!");
    spdlog::set_level(spdlog::level::trace);
    spdlog::debug("This message should be displayed..");

    spdlog::set_default_logger(old_logger);
}